

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall color<unsigned_char,_3U>::normalize(color<unsigned_char,_3U> *this)

{
  vec3<unsigned_char> *in_RDI;
  vec3<unsigned_char> v;
  float local_14;
  float local_10;
  float local_c;
  
  vec3<unsigned_char>::vec3(in_RDI,(float)((ulong)&local_14 >> 0x20),SUB84(&local_14,0),0.0);
  vec3<unsigned_char>::normalize(in_RDI);
  *(char *)&(in_RDI->super_vec3_base).r = (char)(int)local_14;
  *(char *)((long)&(in_RDI->super_vec3_base).r + 1) = (char)(int)local_10;
  *(char *)((long)&(in_RDI->super_vec3_base).r + 2) = (char)(int)local_c;
  return;
}

Assistant:

void normalize() {
        vec3<componentType> v((float)r, (float)g, (float)b);
        v.normalize();
        r = (componentType)v.r;
        g = (componentType)v.g;
        b = (componentType)v.b;
    }